

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O0

string * duckdb::FormatOptionLine<bool>(string *name,CSVOption<bool> *option)

{
  string *in_RDI;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  __rhs = in_RDI;
  ::std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  CSVOption<bool>::FormatValue_abi_cxx11_((CSVOption<bool> *)in_RDI);
  ::std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  ::std::operator+(in_stack_ffffffffffffff18,(char *)__rhs);
  CSVOption<bool>::FormatSet_abi_cxx11_((CSVOption<bool> *)in_stack_ffffffffffffff38);
  ::std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  ::std::operator+(in_stack_ffffffffffffff18,(char *)__rhs);
  ::std::__cxx11::string::~string(local_38);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  ::std::__cxx11::string::~string(local_58);
  ::std::__cxx11::string::~string(local_78);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  ::std::__cxx11::string::~string(local_98);
  return __rhs;
}

Assistant:

string FormatOptionLine(const string &name, const CSVOption<T> &option) {
	return name + " = " + option.FormatValue() + " " + option.FormatSet() + "\n  ";
}